

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Parameters *extraout_RDX_00;
  Parameters *extraout_RDX_01;
  Parameters *extraout_RDX_02;
  Environment env;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  VkPipeline local_378;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_370;
  Move<vk::Handle<(vk::HandleType)18>_> local_358;
  Move<vk::Handle<(vk::HandleType)18>_> local_338;
  Move<vk::Handle<(vk::HandleType)18>_> local_318;
  Environment local_2f0;
  Move<vk::Handle<(vk::HandleType)18>_> local_2b8;
  Resources local_298;
  Resources local_1f8;
  Resources local_158;
  Resources local_b8;
  
  local_2f0.vkp = *(PlatformInterface **)(this + 8);
  local_2f0.vkd = Context::getDeviceInterface((Context *)this);
  local_2f0.device = Context::getDevice((Context *)this);
  local_2f0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_2f0.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_2f0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_2f0.maxResourceConsumers = 1;
  ComputePipeline::Resources::Resources(&local_b8,&local_2f0,extraout_RDX);
  ComputePipeline::Resources::Resources(&local_158,&local_2f0,extraout_RDX_00);
  ComputePipeline::Resources::Resources(&local_1f8,&local_2f0,extraout_RDX_01);
  ComputePipeline::Resources::Resources(&local_298,&local_2f0,extraout_RDX_02);
  ComputePipeline::create(&local_338,&local_2f0,&local_b8,param_4);
  DStack_370.m_device =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_370.m_allocator =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_378.m_internal =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  DStack_370.m_deviceIface =
       local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  ComputePipeline::create(&local_358,&local_2f0,&local_158,param_4);
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  ComputePipeline::create(&local_318,&local_2f0,&local_1f8,param_4);
  local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  ComputePipeline::create(&local_2b8,&local_2f0,&local_298,param_4);
  local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  if (local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_318.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_358.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_338.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_378.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_370,local_378);
  }
  local_378.m_internal = (deUint64)&DStack_370.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_378.m_internal,
             (undefined1 *)
             ((long)&(DStack_370.m_deviceIface)->_vptr_DeviceInterface + local_378.m_internal));
  if ((VkDevice *)local_378.m_internal != &DStack_370.m_device) {
    operator_delete((void *)local_378.m_internal,(ulong)(DStack_370.m_device + 1));
  }
  ComputePipeline::Resources::~Resources(&local_298);
  ComputePipeline::Resources::~Resources(&local_1f8);
  ComputePipeline::Resources::~Resources(&local_158);
  ComputePipeline::Resources::~Resources(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}